

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint uVar1;
  result_type rVar2;
  ostream *poVar3;
  int i_1;
  int iVar4;
  int i;
  long lVar5;
  bool bVar6;
  int new_payload_1;
  Iterator it;
  int new_key;
  undefined4 uStack_20dc;
  int local_20d8;
  uint64_t local_20d0;
  uniform_int_distribution<int> dis;
  int new_payload;
  undefined4 uStack_20bc;
  int local_20b8;
  pair<int,_int> values [100];
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> index;
  mt19937_64 gen;
  
  memset(values,0,800);
  std::random_device::random_device((random_device *)&index);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&gen,(ulong)uVar1);
  std::random_device::~random_device((random_device *)&index);
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0x7fffffff;
  for (lVar5 = 0; lVar5 != 100; lVar5 = lVar5 + 1) {
    values[lVar5].first = (int)lVar5;
    rVar2 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
    values[lVar5].second = rVar2;
  }
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex(&index);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            (&index,values,100);
  for (iVar4 = 100; iVar4 != 200; iVar4 = iVar4 + 1) {
    _new_key = (data_node_type *)CONCAT44(uStack_20dc,iVar4);
    new_payload = std::uniform_int_distribution<int>::operator()(&dis,&gen);
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              ((pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator,_bool>
                *)&it,&index,&new_key,&new_payload);
  }
  for (it.cur_leaf_._0_4_ = 0; (int)it.cur_leaf_ < 10; it.cur_leaf_._0_4_ = (int)it.cur_leaf_ + 1) {
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
              (&index,(int *)&it);
  }
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::begin
            (&it,&index);
  iVar4 = 0xbe;
  while( true ) {
    if ((long)it.cur_idx_ == 0 && CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_) == 0) break;
    if ((*(byte *)(*(long *)(CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_) + 0x48) +
                  (long)it.cur_idx_ * 4) & 1) == 0) {
      rVar2 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
      *(result_type *)
       (*(long *)(CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_) + 0x50) + (long)it.cur_idx_ * 4) =
           rVar2;
    }
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++((Iterator *)&new_key,&it,0);
    iVar4 = iVar4 + -1;
  }
  if (iVar4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 190 entries in the index.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  _new_key = (data_node_type *)CONCAT44(uStack_20dc,0x32);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (&it,&index,&new_key);
  iVar4 = 0x32;
  while( true ) {
    new_payload = 100;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
              ((Iterator *)&new_key,&index,&new_payload);
    if ((it.cur_idx_ == local_20d8) &&
       ((data_node_type *)CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_) == _new_key)) break;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++((Iterator *)&new_key,&it,0);
    iVar4 = iVar4 + -1;
  }
  if (iVar4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 50 entries with keys in the range [50, 100).");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  it.cur_leaf_._0_4_ = 0x32;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            ((Iterator *)&new_key,&index,(int *)&it);
  iVar4 = 0x32;
  while (_new_key->key_slots_[local_20d8] < 100) {
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(&it,(Iterator *)&new_key,0);
    iVar4 = iVar4 + -1;
  }
  if (iVar4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 50 entries with keys in the range [50, 100).");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar4 = 9;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    new_payload = 0x2a;
    new_payload_1 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              ((pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator,_bool>
                *)&it,&index,&new_payload,&new_payload_1);
  }
  new_payload = 0x2a;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (&it,&index,&new_payload);
  iVar4 = 10;
  while( true ) {
    new_payload_1 = 0x2a;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::upper_bound
              ((Iterator *)&new_payload,&index,&new_payload_1);
    if ((it.cur_idx_ == local_20b8) &&
       (CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_) == CONCAT44(uStack_20bc,new_payload))) break;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++((Iterator *)&new_payload,&it,0);
    iVar4 = iVar4 + -1;
  }
  if (iVar4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 10 entries with key of value 42.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  new_payload = 0x539;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::find
            (&it,&index,&new_payload);
  _new_key = (data_node_type *)CONCAT44(it.cur_leaf_._4_4_,(int)it.cur_leaf_);
  local_20d0 = it.cur_bitmap_data_;
  if (_new_key != (data_node_type *)0x0 || it.cur_idx_ != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error! Key with value 1337 should not exist.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Final num keys: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,index.stats_.num_keys);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Num inserts: ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::~Alex(&index)
  ;
  return 0;
}

Assistant:

int main(int, char**) {
  // Create some synthetic data: keys are dense integers between 0 and 99, and
  // payloads are random values
  const int num_keys = 100;
  std::pair<KEY_TYPE, PAYLOAD_TYPE> values[num_keys];
  std::mt19937_64 gen(std::random_device{}());
  std::uniform_int_distribution<PAYLOAD_TYPE> dis;
  for (int i = 0; i < num_keys; i++) {
    values[i].first = i;
    values[i].second = dis(gen);
  }

  alex::Alex<KEY_TYPE, PAYLOAD_TYPE> index;

  // Bulk load the keys [0, 100)
  index.bulk_load(values, num_keys);

  // Insert the keys [100, 200). Now there are 200 keys.
  for (int i = num_keys; i < 2 * num_keys; i++) {
    KEY_TYPE new_key = i;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Erase the keys [0, 10). Now there are 190 keys.
  for (int i = 0; i < 10; i++) {
    index.erase(i);
  }

  // Iterate through all entries in the index and update their payload if the
  // key is even
  int num_entries = 0;
  for (auto it = index.begin(); it != index.end(); it++) {
    if (it.key() % 2 == 0) {  // it.key() is equivalent to (*it).first
      it.payload() = dis(gen);
    }
    num_entries++;
  }
  if (num_entries != 190) {
    std::cout << "Error! There should be 190 entries in the index."
              << std::endl;
  }

  // Iterate through all entries with keys between 50 (inclusive) and 100
  // (exclusive)
  num_entries = 0;
  for (auto it = index.lower_bound(50); it != index.lower_bound(100); it++) {
    num_entries++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Equivalent way of iterating through all entries with keys between 50
  // (inclusive) and 100 (exclusive)
  num_entries = 0;
  auto it = index.lower_bound(50);
  while (it.key() < 100 && it != index.end()) {
    num_entries++;
    it++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Insert 9 more keys with value 42. Now there are 199 keys.
  for (int i = 0; i < 9; i++) {
    KEY_TYPE new_key = 42;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Iterate through all 10 entries with keys of value 42
  int num_duplicates = 0;
  for (auto it = index.lower_bound(42); it != index.upper_bound(42); it++) {
    num_duplicates++;
  }
  if (num_duplicates != 10) {
    std::cout << "Error! There should be 10 entries with key of value 42."
              << std::endl;
  }

  // Check if a non-existent key exists
  it = index.find(1337);
  if (it != index.end()) {
    std::cout << "Error! Key with value 1337 should not exist." << std::endl;
  }

  // Look at some stats
  auto stats = index.get_stats();
  std::cout << "Final num keys: " << stats.num_keys
            << std::endl;  // expected: 199
  std::cout << "Num inserts: " << stats.num_inserts
            << std::endl;  // expected: 109
}